

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# announce_entry.cpp
# Opt level: O0

void __thiscall libtorrent::aux::announce_entry::announce_entry(announce_entry *this)

{
  announce_entry *this_local;
  
  boost::intrusive::list_member_hook<>::list_member_hook(&this->list_hook);
  ::std::__cxx11::string::string((string *)&this->url);
  ::std::__cxx11::string::string((string *)&this->trackerid);
  ::std::
  vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>::
  vector(&this->endpoints);
  this->listen_socket_version = 0;
  this->tier = '\0';
  this->fail_limit = '\0';
  this->field_0x6e = this->field_0x6e & 0xf0;
  this->field_0x6e = this->field_0x6e & 0xef;
  return;
}

Assistant:

announce_entry::announce_entry()
		: source(0)
		, verified(false)
	{}